

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O2

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_int>::update_DA
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_int> *this,sa_leaf L1,sa_leaf L2,
          bool compute_lcp,uint64_t *lcp_values,uint64_t *m)

{
  pointer puVar1;
  uint64_t uVar2;
  uint64_t i_1;
  ulong __n;
  uint64_t i;
  ulong uVar3;
  reference rVar4;
  
  __n = L1.rn.second + L2.rn.first;
  for (uVar3 = L2.rn.first + L1.rn.first; uVar3 < __n; uVar3 = uVar3 + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->DA,uVar3);
    *rVar4._M_p = *rVar4._M_p & ~rVar4._M_mask;
    *m = *m + 1;
  }
  for (; __n < L2.rn.second + L1.rn.second; __n = __n + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->DA,__n);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
    *m = *m + 1;
  }
  if (compute_lcp) {
    uVar2 = *lcp_values;
    puVar1 = (this->LCP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = L1.rn.first + L2.rn.first;
    while( true ) {
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + 1;
      if (L2.rn.second + L1.rn.second <= uVar3) break;
      puVar1[uVar3] = (uint)L1.depth;
      *lcp_values = uVar2;
    }
  }
  return;
}

Assistant:

void update_DA(sa_leaf L1,sa_leaf L2, bool compute_lcp, uint64_t & lcp_values, uint64_t & m){

		uint64_t start1 = L1.rn.first + L2.rn.first;//start position of first interval in merged intervals
		uint64_t start2 = L2.rn.first + L1.rn.second;//start position of second interval in merged intervals
		uint64_t end = L1.rn.second + L2.rn.second;//end position (excluded) of merged intervals

		assert(end>start1);

		for(uint64_t i = start1; i<start2; ++i){
			DA[i] = 0;
			m++;
		}

		for(uint64_t i = start2; i<end; ++i){
			DA[i] = 1;
			m++;
		}

		assert(L1.depth==L2.depth);

		if(compute_lcp){

			for(uint64_t i = start1+1; i<end; ++i){

				assert(LCP[i]==nil);

				LCP[i] = L1.depth;

				lcp_values++;

			}

		}

		assert(m<=n);

	}